

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceGroup * __thiscall cmMakefile::GetOrCreateSourceGroup(cmMakefile *this,string *name)

{
  char *pcVar1;
  cmSourceGroup *pcVar2;
  char *__s;
  allocator<char> local_51;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"SOURCE_GROUP_DELIMITER",(allocator<char> *)&local_30);
  pcVar1 = GetDefinition(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  __s = "\\";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  cmSystemTools::tokenize(&local_30,name,&local_50);
  pcVar2 = GetOrCreateSourceGroup(this,&local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return pcVar2;
}

Assistant:

cmSourceGroup* cmMakefile::GetOrCreateSourceGroup(const std::string& name)
{
  const char* delimiter = this->GetDefinition("SOURCE_GROUP_DELIMITER");
  if (delimiter == nullptr) {
    delimiter = "\\";
  }
  return this->GetOrCreateSourceGroup(
    cmSystemTools::tokenize(name, delimiter));
}